

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_get_color_profile
               (LodePNGColorProfile *profile,uchar *in,uint w,uint h,LodePNGColorMode *mode_in)

{
  LodePNGColorType LVar1;
  uint uVar2;
  uint uVar3;
  byte g_00;
  byte bVar4;
  uint uVar5;
  int iVar6;
  byte bVar7;
  uint uVar8;
  byte bVar9;
  undefined8 in_R10;
  undefined7 uVar10;
  byte bVar11;
  size_t sVar12;
  size_t i;
  char cVar13;
  LodePNGColorProfile *pLVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  unsigned_short a;
  ColorTree tree;
  unsigned_short local_116;
  unsigned_short local_114;
  unsigned_short local_112;
  unsigned_short local_110;
  char local_10d;
  uint local_10c;
  uint local_108;
  byte local_104;
  byte local_103;
  byte local_102;
  byte local_101;
  ulong local_100;
  uint local_f4;
  LodePNGColorProfile *local_f0;
  LodePNGColorMode *local_e8;
  uchar *local_e0;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  size_t local_c8;
  size_t local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  int local_38;
  
  local_100 = (ulong)h;
  LVar1 = mode_in->colortype;
  local_f0 = profile;
  local_e0 = in;
  uVar5 = lodepng_can_have_alpha(mode_in);
  pLVar14 = local_f0;
  iVar6 = 0;
  if ((ulong)LVar1 < 7) {
    iVar6 = *(int *)(&DAT_00115b6c + (ulong)LVar1 * 4);
  }
  local_f4 = iVar6 * mode_in->bitdepth;
  local_100 = local_100 * w;
  uVar2 = local_f0->bits;
  local_d0 = 0x101;
  if ((local_f4 < 9) &&
     (local_d0 = (1 << ((byte)local_f4 & 0x1f)) + local_f0->numcolors, 0x100 < local_d0)) {
    local_d0 = 0x101;
  }
  local_108 = CONCAT31(local_108._1_3_,(LVar1 & ~LCT_GREY_ALPHA) == LCT_GREY);
  local_f0->numpixels = local_f0->numpixels + local_100;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_38 = -1;
  local_10c = 1;
  if (local_f0->alpha == 0) {
    local_10c = uVar5 ^ 1;
  }
  uVar5 = local_f0->colored;
  cVar13 = local_f4 <= uVar2 || local_f4 == 1 && uVar2 == 1;
  bVar16 = local_d0 <= local_f0->numcolors;
  bVar17 = bVar16 || uVar2 == 0x10;
  local_e8 = mode_in;
  if ((!bVar16 && uVar2 != 0x10) && (local_f0->numcolors != 0)) {
    uVar15 = 0;
    do {
      color_tree_add((ColorTree *)local_b8,pLVar14->palette[uVar15 * 4],
                     pLVar14->palette[uVar15 * 4 + 1],pLVar14->palette[uVar15 * 4 + 2],
                     pLVar14->palette[uVar15 * 4 + 3],(uint)uVar15);
      uVar15 = uVar15 + 1;
    } while (uVar15 < pLVar14->numcolors);
  }
  bVar9 = (byte)local_108 | uVar5 != 0;
  uVar5 = (uint)bVar17;
  bVar16 = true;
  pLVar14 = local_f0;
  if ((local_e8->bitdepth == 0x10) && (bVar16 = local_100 == 0, !bVar16)) {
    local_108 = (uint)bVar17;
    getPixelColorRGBA16(&local_112,&local_114,&local_116,&local_110,local_e0,0,local_e8);
    pLVar14 = local_f0;
    if ((local_112 & 0xff) == local_112 >> 8) {
      sVar12 = 1;
      do {
        if ((((local_114 & 0xff) != local_114 >> 8) || ((local_116 & 0xff) != local_116 >> 8)) ||
           ((local_110 & 0xff) != local_110 >> 8)) break;
        bVar16 = local_100 == sVar12;
        uVar5 = local_108;
        if (bVar16) goto LAB_00108bad;
        getPixelColorRGBA16(&local_112,&local_114,&local_116,&local_110,local_e0,sVar12,local_e8);
        sVar12 = sVar12 + 1;
      } while ((local_112 & 0xff) == local_112 >> 8);
    }
    pLVar14->bits = 0x10;
    cVar13 = true;
    uVar5 = 1;
  }
LAB_00108bad:
  local_108 = (uint)bVar9;
  if (bVar16) {
    local_112 = local_112 & 0xff00;
    local_114 = local_114 & 0xff00;
    local_116 = local_116 & 0xff00;
    local_110 = local_110 & 0xff00;
    if (local_100 != 0) {
      local_c8 = local_100 - 1;
      sVar12 = 0;
      do {
        uVar2 = local_f4;
        getPixelColorRGBA8((uchar *)&local_112,(uchar *)&local_114,(uchar *)&local_116,
                           (uchar *)&local_110,local_e0,sVar12,local_e8);
        bVar9 = (byte)local_112;
        if ((cVar13 == '\0') && (pLVar14->bits < 8)) {
          uVar8 = 1;
          if (1 < (byte)((byte)local_112 + 1)) {
            uVar8 = 8;
            if ((uint)(byte)local_112 * -0xf0f0f0f < 0xf0f0f10) {
              uVar8 = (uint)(0x3030303 < (uint)(byte)local_112 * -0x3030303) * 2 + 2;
            }
          }
          if (pLVar14->bits < uVar8) {
            pLVar14->bits = uVar8;
          }
        }
        uVar8 = pLVar14->bits;
        uVar15 = CONCAT71((int7)((ulong)in_R10 >> 8),1);
        bVar17 = local_108 == 0;
        local_108 = 1;
        g_00 = (byte)local_114;
        bVar7 = (byte)local_116;
        if (bVar17) {
          if ((byte)local_112 == (byte)local_114) {
            uVar15 = 0;
            local_108 = 0;
            if ((byte)local_112 == (byte)local_116) goto LAB_00108cd5;
          }
          pLVar14->colored = 1;
          uVar10 = (undefined7)(uVar15 >> 8);
          uVar15 = CONCAT71(uVar10,1);
          local_108 = 1;
          if (uVar8 < 8) {
            pLVar14->bits = 8;
            uVar15 = CONCAT71(uVar10,1);
          }
        }
LAB_00108cd5:
        bVar4 = (byte)local_110;
        if (local_10c == 0) {
          if ((pLVar14->key_r == (local_112 & 0xff)) && (pLVar14->key_g == (local_114 & 0xff))) {
            bVar17 = pLVar14->key_b == (local_116 & 0xff);
          }
          else {
            bVar17 = false;
          }
          if ((byte)local_110 == 0xff) {
            bVar11 = 0;
            local_10c = 0;
            if ((bool)(pLVar14->key != 0 & bVar17)) {
              pLVar14->alpha = 1;
              pLVar14->key = 0;
              uVar3 = pLVar14->bits;
              goto joined_r0x00108edd;
            }
          }
          else {
            if (((byte)local_110 != 0) || (!(bool)(pLVar14->key == 0 | bVar17))) {
              pLVar14->alpha = 1;
              pLVar14->key = 0;
              uVar3 = pLVar14->bits;
joined_r0x00108edd:
              if (uVar3 < 8) {
                pLVar14->bits = 8;
              }
              goto LAB_00108ce4;
            }
            local_10c = 0;
            if ((pLVar14->alpha == 0) && (pLVar14->key == 0)) {
              pLVar14->key = 1;
              pLVar14->key_r = local_112 & 0xff;
              pLVar14->key_g = local_114 & 0xff;
              pLVar14->key_b = local_116 & 0xff;
              bVar11 = 0;
              local_10c = 0;
            }
            else {
              bVar11 = 0;
            }
          }
        }
        else {
LAB_00108ce4:
          bVar11 = 1;
          local_10c = 1;
        }
        bVar17 = uVar5 == 0;
        uVar5 = 1;
        cVar13 = uVar2 <= uVar8;
        local_c0 = sVar12;
        if (bVar17) {
          local_102 = (byte)local_112;
          local_101 = (byte)local_114;
          local_cc = (uint)(byte)local_110;
          local_d8 = (uint)uVar15;
          local_10d = uVar2 <= uVar8;
          local_d4 = uVar8;
          iVar6 = color_tree_get((ColorTree *)local_b8,(byte)local_112,(byte)local_114,
                                 (byte)local_116,(byte)local_110);
          pLVar14 = local_f0;
          uVar15 = (ulong)local_d8;
          uVar5 = 0;
          cVar13 = local_10d;
          uVar8 = local_d4;
          if (iVar6 < 0) {
            local_104 = bVar4;
            local_103 = bVar7;
            color_tree_add((ColorTree *)local_b8,bVar9,g_00,bVar7,(uchar)local_cc,
                           local_f0->numcolors);
            uVar5 = pLVar14->numcolors;
            if ((ulong)uVar5 < 0x100) {
              uVar15 = (ulong)(uVar5 * 4);
              pLVar14->palette[(ulong)uVar5 * 4] = local_102;
              pLVar14->palette[uVar15 + 1] = local_101;
              pLVar14->palette[uVar15 + 2] = local_103;
              pLVar14->palette[uVar15 + 3] = local_104;
            }
            pLVar14->numcolors = uVar5 + 1;
            uVar5 = (uint)(local_d0 <= uVar5 + 1);
            uVar15 = (ulong)local_d8;
            cVar13 = local_10d;
            uVar8 = local_d4;
          }
        }
        bVar9 = (byte)uVar15 & bVar11 & (byte)uVar5;
        in_R10 = CONCAT71((int7)(uVar15 >> 8),bVar9);
        pLVar14 = local_f0;
      } while (((bVar9 & local_f4 <= uVar8) == 0) && (sVar12 = local_c0 + 1, local_c8 != local_c0));
    }
    if ((pLVar14->key != 0) && (local_100 != 0 && pLVar14->alpha == 0)) {
      sVar12 = 0;
      do {
        getPixelColorRGBA8((uchar *)&local_112,(uchar *)&local_114,(uchar *)&local_116,
                           (uchar *)&local_110,local_e0,sVar12,local_e8);
        if (((((byte)local_110 != '\0') && (pLVar14->key_r == (local_112 & 0xff))) &&
            (pLVar14->key_g == (local_114 & 0xff))) && (pLVar14->key_b == (local_116 & 0xff))) {
          pLVar14->alpha = 1;
          pLVar14->key = 0;
          if (pLVar14->bits < 8) {
            pLVar14->bits = 8;
          }
        }
        sVar12 = sVar12 + 1;
      } while (local_100 != sVar12);
    }
    uVar15._0_2_ = pLVar14->key_r;
    uVar15._2_2_ = pLVar14->key_g;
    uVar15._4_2_ = pLVar14->key_b;
    uVar15._6_2_ = *(undefined2 *)&pLVar14->field_0xe;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar15;
    auVar18 = psllw(auVar18,8);
    pLVar14->key_r = auVar18._0_2_ + (undefined2)uVar15;
    pLVar14->key_g = auVar18._2_2_ + uVar15._2_2_;
    pLVar14->key_b = (short)(*(int *)&pLVar14->key_b << 8) + (short)*(int *)&pLVar14->key_b;
  }
  else {
    local_112 = 0;
    local_114 = 0;
    local_116 = 0;
    local_110 = 0;
    if (local_100 != 0) {
      sVar12 = local_100 - 1;
      i = 0;
      do {
        getPixelColorRGBA16(&local_112,&local_114,&local_116,&local_110,local_e0,i,local_e8);
        bVar9 = 1;
        bVar17 = local_108 == 0;
        local_108 = 1;
        if (bVar17) {
          if (local_112 == local_114) {
            bVar9 = 0;
            local_108 = 0;
            if (local_112 == local_116) goto LAB_00108fd2;
          }
          pLVar14->colored = 1;
          bVar9 = 1;
          local_108 = 1;
        }
LAB_00108fd2:
        if (local_10c == 0) {
          if ((local_112 == pLVar14->key_r) && (local_114 == pLVar14->key_g)) {
            bVar17 = local_116 == pLVar14->key_b;
          }
          else {
            bVar17 = false;
          }
          if (local_110 == 0xffff) {
            bVar7 = 0;
            local_10c = 0;
            if ((bool)(pLVar14->key != 0 & bVar17)) goto LAB_0010907c;
          }
          else {
            if ((local_110 != 0) || (!(bool)(pLVar14->key == 0 | bVar17))) {
LAB_0010907c:
              pLVar14->alpha = 1;
              pLVar14->key = 0;
              goto LAB_0010908e;
            }
            if ((pLVar14->alpha == 0) && (pLVar14->key == 0)) {
              pLVar14->key = 1;
              pLVar14->key_r = local_112;
              pLVar14->key_g = local_114;
              pLVar14->key_b = local_116;
              bVar7 = 0;
              local_10c = 0;
            }
            else {
              bVar7 = 0;
              local_10c = 0;
            }
          }
        }
        else {
LAB_0010908e:
          bVar7 = 1;
          local_10c = 1;
        }
      } while (((bVar9 & bVar7 & (byte)uVar5 & (bool)cVar13 != false) == 0) &&
              (bVar17 = sVar12 != i, i = i + 1, bVar17));
    }
    if ((pLVar14->key != 0) && (local_100 != 0 && pLVar14->alpha == 0)) {
      sVar12 = 0;
      do {
        getPixelColorRGBA16(&local_112,&local_114,&local_116,&local_110,local_e0,sVar12,local_e8);
        if ((((local_110 != 0) && (local_112 == pLVar14->key_r)) && (local_114 == pLVar14->key_g))
           && (local_116 == pLVar14->key_b)) {
          pLVar14->alpha = 1;
          pLVar14->key = 0;
        }
        sVar12 = sVar12 + 1;
      } while (local_100 != sVar12);
    }
  }
  color_tree_cleanup((ColorTree *)local_b8);
  return 0;
}

Assistant:

unsigned lodepng_get_color_profile(LodePNGColorProfile* profile,
                                   const unsigned char* in, unsigned w, unsigned h,
                                   const LodePNGColorMode* mode_in)
{
  unsigned error = 0;
  size_t i;
  ColorTree tree;
  size_t numpixels = (size_t)w * (size_t)h;

  /* mark things as done already if it would be impossible to have a more expensive case */
  unsigned colored_done = lodepng_is_greyscale_type(mode_in) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode_in) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode_in);
  unsigned bits_done = (profile->bits == 1 && bpp == 1) ? 1 : 0;
  unsigned sixteen = 0; /* whether the input image is 16 bit */
  unsigned maxnumcolors = 257;
  if(bpp <= 8) maxnumcolors = LODEPNG_MIN(257, profile->numcolors + (1 << bpp));

  profile->numpixels += numpixels;

  color_tree_init(&tree);

  /*If the profile was already filled in from previous data, fill its palette in tree
  and mark things as done already if we know they are the most expensive case already*/
  if(profile->alpha) alpha_done = 1;
  if(profile->colored) colored_done = 1;
  if(profile->bits == 16) numcolors_done = 1;
  if(profile->bits >= bpp) bits_done = 1;
  if(profile->numcolors >= maxnumcolors) numcolors_done = 1;

  if(!numcolors_done)
  {
    for(i = 0; i < profile->numcolors; i++)
    {
      const unsigned char* color = &profile->palette[i * 4];
      color_tree_add(&tree, color[0], color[1], color[2], color[3], i);
    }
  }

  /*Check if the 16-bit input is truly 16-bit*/
  if(mode_in->bitdepth == 16 && !sixteen)
  {
    unsigned short r, g, b, a;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      if((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
         (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/
      {
        profile->bits = 16;
        sixteen = 1;
        bits_done = 1;
        numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/
        break;
      }
    }
  }

  if(sixteen)
  {
    unsigned short r = 0, g = 0, b = 0, a = 0;

    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 65535 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 65535 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
        }
      }
      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(profile->key && !profile->alpha)
    {
      for(i = 0; i != numpixels; ++i)
      {
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
        if(a != 0 && r == profile->key_r && g == profile->key_g && b == profile->key_b)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
        }
      }
    }
  }
  else /* < 16-bit */
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);

      if(!bits_done && profile->bits < 8)
      {
        /*only r is checked, < 8 bits is only relevant for greyscale*/
        unsigned bits = getValueRequiredBits(r);
        if(bits > profile->bits) profile->bits = bits;
      }
      bits_done = (profile->bits >= bpp);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
        if(profile->bits < 8) profile->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 255 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 255 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if(!numcolors_done)
      {
        if(!color_tree_has(&tree, r, g, b, a))
        {
          color_tree_add(&tree, r, g, b, a, profile->numcolors);
          if(profile->numcolors < 256)
          {
            unsigned char* p = profile->palette;
            unsigned n = profile->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++profile->numcolors;
          numcolors_done = profile->numcolors >= maxnumcolors;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(profile->key && !profile->alpha)
    {
      for(i = 0; i != numpixels; ++i)
      {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
        if(a != 0 && r == profile->key_r && g == profile->key_g && b == profile->key_b)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }
    }

    /*make the profile's key always 16-bit for consistency - repeat each byte twice*/
    profile->key_r += (profile->key_r << 8);
    profile->key_g += (profile->key_g << 8);
    profile->key_b += (profile->key_b << 8);
  }

  color_tree_cleanup(&tree);
  return error;
}